

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::ParseGoogleTestFlagsOnly(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  long lVar3;
  _Alloc_hider _Var4;
  int iVar5;
  undefined1 auStack_78 [32];
  char **ppcStack_58;
  string sStack_50;
  
  auStack_78._0_8_ = auStack_78 + 0x10;
  auStack_78._8_8_ = 0;
  auStack_78[0x10] = '\0';
  _Var4._M_p = (pointer)argc;
  if (1 < *argc) {
    ppcStack_58 = argv + 1;
    iVar5 = 1;
    do {
      StreamableToString<char*>(&sStack_50,(internal *)(argv + iVar5),in_RDX);
      _Var4._M_p = sStack_50._M_dataplus._M_p;
      bVar1 = ParseGoogleTestFlag(sStack_50._M_dataplus._M_p);
      in_RDX = extraout_RDX;
      if (bVar1) {
LAB_0014eecd:
        iVar2 = *argc;
        if (iVar2 != iVar5) {
          in_RDX = ppcStack_58 + iVar5;
          lVar3 = 0;
          do {
            in_RDX[lVar3 + -1] = in_RDX[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar2 - iVar5 != (int)lVar3);
        }
        *argc = iVar2 + -1;
        iVar5 = iVar5 + -1;
      }
      else {
        bVar1 = ParseFlag<std::__cxx11::string>
                          (_Var4._M_p,"flagfile",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_78);
        if (bVar1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &FLAGS_gtest_flagfile_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78
                    );
          LoadFlagsFromFile((string *)auStack_78._0_8_);
          in_RDX = extraout_RDX_00;
          goto LAB_0014eecd;
        }
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&sStack_50,"--help");
        in_RDX = extraout_RDX_02;
        if ((iVar2 == 0) ||
           (bVar1 = HasGoogleTestFlagPrefix((char *)0x14ef3f), in_RDX = extraout_RDX_03, bVar1)) {
          g_help_flag = '\x01';
        }
      }
      _Var4._M_p = sStack_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_50._M_dataplus._M_p != &sStack_50.field_2) {
        operator_delete(sStack_50._M_dataplus._M_p,sStack_50.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_01;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded(_Var4._M_p);
  }
  if ((string *)auStack_78._0_8_ != (string *)(auStack_78 + 0x10)) {
    operator_delete((void *)auStack_78._0_8_,CONCAT71(auStack_78._17_7_,auStack_78[0x10]) + 1);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnly(int* argc, char** argv) {
#if GTEST_HAS_ABSL
  if (*argc > 0) {
    // absl::ParseCommandLine() requires *argc > 0.
    auto positional_args = absl::flags_internal::ParseCommandLineImpl(
        *argc, argv, absl::flags_internal::ArgvListAction::kRemoveParsedArgs,
        absl::flags_internal::UsageFlagsAction::kHandleUsage,
        absl::flags_internal::OnUndefinedFlag::kReportUndefined);
    // Any command-line positional arguments not part of any command-line flag
    // (or arguments to a flag) are copied back out to argv, with the program
    // invocation name at position 0, and argc is resized. This includes
    // positional arguments after the flag-terminating delimiter '--'.
    // See https://abseil.io/docs/cpp/guides/flags.
    std::copy(positional_args.begin(), positional_args.end(), argv);
    if (static_cast<int>(positional_args.size()) < *argc) {
      argv[positional_args.size()] = nullptr;
      *argc = static_cast<int>(positional_args.size());
    }
  }
#else
  ParseGoogleTestFlagsOnlyImpl(argc, argv);
#endif

  // Fix the value of *_NSGetArgc() on macOS, but if and only if
  // *_NSGetArgv() == argv
  // Only applicable to char** version of argv
#if GTEST_OS_MAC
#ifndef GTEST_OS_IOS
  if (*_NSGetArgv() == argv) {
    *_NSGetArgc() = *argc;
  }
#endif
#endif
}